

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O2

int Sim_UtilMatrsAreDisjoint(Sym_Man_t *p)

{
  int iVar1;
  Extra_BitMat_t *p1;
  Extra_BitMat_t *p2;
  int i;
  
  i = 0;
  do {
    if (p->nOutputs <= i) {
      return 1;
    }
    p1 = (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrSymms,i);
    p2 = (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrNonSymms,i);
    iVar1 = Extra_BitMatrixIsDisjoint(p1,p2);
    i = i + 1;
  } while (iVar1 != 0);
  return 0;
}

Assistant:

int Sim_UtilMatrsAreDisjoint( Sym_Man_t * p )
{
    int i;
    for ( i = 0; i < p->nOutputs; i++ )
        if ( !Extra_BitMatrixIsDisjoint( (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrSymms,i), (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrNonSymms,i) ) )
            return 0;
    return 1;
}